

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::Int32ParseTester::_InternalSerialize
          (Int32ParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  int iVar2;
  LongSooRep *pLVar3;
  int *piVar4;
  uint8_t *puVar5;
  byte *extraout_RAX;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  byte *extraout_RAX_03;
  byte *pbVar6;
  byte *extraout_RAX_04;
  ulong in_RCX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  LongSooRep *unaff_R13;
  byte *pbVar12;
  bool bVar13;
  
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar10 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.optional_int32_lowfield_,target);
  }
  uVar9 = *(uint *)((long)&this->field_0 + 0x30);
  if ((int)uVar9 < 1) {
LAB_00c502e6:
    uVar11 = *(uint *)((long)&this->field_0 + 0x48);
    if ((int)uVar11 < 1) goto LAB_00c503b1;
    pbVar6 = stream->end_;
    if (pbVar6 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar6 = stream->end_;
    }
    if (pbVar6 <= target) {
      _InternalSerialize();
      pbVar6 = extraout_RAX_00;
      goto LAB_00c50894;
    }
    unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int32_lowfield_;
    *target = 0x1a;
    pbVar6 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) goto LAB_00c50852;
  }
  else {
    pbVar6 = stream->end_;
    if (pbVar6 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar6 = stream->end_;
    }
    if (target < pbVar6) {
      this_00 = &(this->field_0)._impl_.repeated_int32_lowfield_;
      *target = 0x12;
      pbVar6 = target + 1;
      uVar11 = uVar9;
      if (0x7f < uVar9) {
        do {
          target = pbVar6;
          *target = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar6 = target + 1;
          bVar13 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar13);
      }
      *pbVar6 = (byte)uVar9;
      if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_int32_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)
                 google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
        bVar13 = (undefined1  [16])
                 ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
      goto LAB_00c502e6;
    }
    _InternalSerialize();
    pbVar6 = extraout_RAX;
LAB_00c50852:
    do {
      target = pbVar6;
      *target = (byte)uVar9 | 0x80;
      uVar11 = uVar9 >> 7;
      pbVar6 = target + 1;
      bVar13 = 0x3fff < uVar9;
      uVar9 = uVar11;
    } while (bVar13);
  }
  *pbVar6 = (byte)uVar11;
  if ((unaff_R13->elements_int & 4) == 0) {
    pLVar3 = (LongSooRep *)
             ((long)&(this->field_0)._impl_.packed_int32_lowfield_.soo_rep_.field_0 + 8);
    bVar13 = true;
  }
  else {
    pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
    bVar13 = (unaff_R13->elements_int & 4) == 0;
  }
  target = target + 2;
  iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
  unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
  do {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    in_RCX = (ulong)(int)pLVar3->elements_int;
    uVar7 = in_RCX;
    if (0x7f < in_RCX) {
      do {
        *target = (byte)uVar7 | 0x80;
        in_RCX = uVar7 >> 7;
        target = target + 1;
        bVar13 = 0x3fff < uVar7;
        uVar7 = in_RCX;
      } while (bVar13);
    }
    pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
    *target = (byte)in_RCX;
    target = target + 1;
  } while (pLVar3 < unaff_R13);
LAB_00c503b1:
  if ((uVar10 & 4) == 0) goto LAB_00c503e9;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (ulong)(this->field_0)._impl_.other_field_;
  pbVar6 = target + 2;
  target[0] = 0x98;
  target[1] = 6;
  uVar7 = in_RCX;
  if (0x7f < in_RCX) goto LAB_00c5099b;
  do {
    *pbVar6 = (byte)in_RCX;
    target = pbVar6 + 1;
LAB_00c503e9:
    if ((uVar10 & 2) != 0) {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      in_RCX = (ulong)(this->field_0)._impl_.optional_int32_midfield_;
      pbVar6 = target + 2;
      target[0] = 200;
      target[1] = 0x3e;
      uVar7 = in_RCX;
      if (0x7f < in_RCX) {
        do {
          *pbVar6 = (byte)uVar7 | 0x80;
          in_RCX = uVar7 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar13 = 0x3fff < uVar7;
          uVar7 = in_RCX;
        } while (bVar13);
      }
      *pbVar6 = (byte)in_RCX;
      target = pbVar6 + 1;
    }
    uVar9 = *(uint *)((long)&this->field_0 + 0x60);
    if ((int)uVar9 < 1) {
LAB_00c504f1:
      uVar11 = *(uint *)((long)&this->field_0 + 0x78);
      if ((int)uVar11 < 1) goto LAB_00c505c7;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int32_midfield_;
        target[0] = 0xda;
        target[1] = 0x3e;
        pbVar6 = target + 2;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c508d6;
        pbVar12 = target + 1;
        goto LAB_00c50534;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_02;
LAB_00c50918:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar13);
LAB_00c50646:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_int32_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
    }
    else {
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_int32_midfield_;
        target[0] = 0xd2;
        target[1] = 0x3e;
        pbVar6 = target + 2;
        uVar11 = uVar9;
        if (uVar9 < 0x80) {
          pbVar12 = target + 1;
        }
        else {
LAB_00c50894:
          do {
            pbVar12 = pbVar6;
            *pbVar12 = (byte)uVar11 | 0x80;
            uVar9 = uVar11 >> 7;
            pbVar6 = pbVar12 + 1;
            bVar13 = 0x3fff < uVar11;
            uVar11 = uVar9;
          } while (bVar13);
        }
        *pbVar6 = (byte)uVar9;
        if ((unaff_R13->elements_int & 4) == 0) {
          pLVar3 = (LongSooRep *)
                   ((long)&(this->field_0)._impl_.repeated_int32_midfield_.soo_rep_.field_0 + 8);
          bVar13 = true;
        }
        else {
          pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
          bVar13 = (unaff_R13->elements_int & 4) == 0;
        }
        target = pbVar12 + 2;
        iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
        unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
        do {
          if (stream->end_ <= target) {
            target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
          }
          in_RCX = (ulong)(int)pLVar3->elements_int;
          uVar7 = in_RCX;
          if (0x7f < in_RCX) {
            do {
              *target = (byte)uVar7 | 0x80;
              in_RCX = uVar7 >> 7;
              target = target + 1;
              bVar13 = 0x3fff < uVar7;
              uVar7 = in_RCX;
            } while (bVar13);
          }
          pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
          *target = (byte)in_RCX;
          target = target + 1;
        } while (pLVar3 < unaff_R13);
        goto LAB_00c504f1;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_01;
LAB_00c508d6:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c50534:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_int32_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c505c7:
      if ((uVar10 & 8) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_int32_hifield_;
        pbVar6 = target + 4;
        target[0] = 0x88;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x90);
      if (0 < (int)uVar9) {
        pbVar6 = stream->end_;
        if (pbVar6 <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
          pbVar6 = stream->end_;
        }
        if (target < pbVar6) {
          unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_int32_hifield_;
          target[0] = 0x92;
          target[1] = 0xa4;
          target[2] = 0xe8;
          target[3] = 3;
          pbVar6 = target + 4;
          uVar10 = uVar9;
          if (0x7f < uVar9) goto LAB_00c50918;
          pbVar12 = target + 3;
          goto LAB_00c50646;
        }
        _InternalSerialize();
        pbVar6 = extraout_RAX_03;
        goto LAB_00c50958;
      }
    }
    uVar10 = *(uint *)((long)&this->field_0 + 0xa8);
    if ((int)uVar10 < 1) goto LAB_00c507b2;
    pbVar6 = stream->end_;
    if (pbVar6 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar6 = stream->end_;
    }
    if (target < pbVar6) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int32_hifield_;
      target[0] = 0x9a;
      target[1] = 0xa4;
      target[2] = 0xe8;
      target[3] = 3;
      pbVar6 = target + 4;
      uVar9 = uVar10;
      if (uVar10 < 0x80) {
        pbVar12 = target + 3;
      }
      else {
LAB_00c50958:
        do {
          pbVar12 = pbVar6;
          *pbVar12 = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = pbVar12 + 1;
          bVar13 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar13);
      }
      *pbVar6 = (byte)uVar10;
      if ((unaff_R13->elements_int & 4) == 0) {
        piVar4 = (int *)((long)&this->field_0 + 0xa0);
        bVar13 = true;
      }
      else {
        piVar4 = (int *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      piVar1 = piVar4 + iVar2;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar8 = (ulong)*piVar4;
        uVar7 = uVar8;
        if (0x7f < uVar8) {
          do {
            *target = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar13);
        }
        piVar4 = piVar4 + 1;
        *target = (byte)uVar8;
        target = target + 1;
      } while (piVar4 < piVar1);
LAB_00c507b2:
      if (*(short *)((long)&this->field_0 + 10) != 0) {
        target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                           (&(this->field_0)._impl_._extensions_,
                            (MessageLite *)_Int32ParseTester_default_instance_,target,stream);
      }
      uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar7 & 1) != 0) {
        puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                           ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
        return puVar5;
      }
      return target;
    }
    _InternalSerialize();
    pbVar6 = extraout_RAX_04;
    uVar7 = in_RCX;
LAB_00c5099b:
    do {
      *pbVar6 = (byte)uVar7 | 0x80;
      in_RCX = uVar7 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar13 = 0x3fff < uVar7;
      uVar7 = in_RCX;
    } while (bVar13);
  } while( true );
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Int32ParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Int32ParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.Int32ParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32_lowfield(), target);
  }

  // repeated int32 repeated_int32_lowfield = 2;
  {
    int byte_size = this_._impl_._repeated_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_repeated_int32_lowfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_lowfield = 3 [features = {
  {
    int byte_size = this_._impl_._packed_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          3, this_._internal_packed_int32_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // int32 optional_int32_midfield = 1001;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1001, this_._internal_optional_int32_midfield(), target);
  }

  // repeated int32 repeated_int32_midfield = 1002;
  {
    int byte_size = this_._impl_._repeated_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1002, this_._internal_repeated_int32_midfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_midfield = 1003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1003, this_._internal_packed_int32_midfield(), byte_size, target);
    }
  }

  // int32 optional_int32_hifield = 1000001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1000001, this_._internal_optional_int32_hifield(), target);
  }

  // repeated int32 repeated_int32_hifield = 1000002;
  {
    int byte_size = this_._impl_._repeated_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000002, this_._internal_repeated_int32_hifield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_hifield = 1000003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000003, this_._internal_packed_int32_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.Int32ParseTester)
  return target;
}